

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<double,QColor>>::emplace<std::pair<double,QColor>const&>
          (QMovableArrayOps<std::pair<double,QColor>> *this,qsizetype i,pair<double,_QColor> *args)

{
  double *pdVar1;
  double dVar2;
  undefined8 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  ushort uVar6;
  Spec SVar7;
  int *piVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  
  piVar8 = *(int **)this;
  if ((piVar8 == (int *)0x0) || (1 < *piVar8)) {
LAB_0035a269:
    dVar2 = args->first;
    SVar7 = (args->second).cspec;
    uVar3 = *(undefined8 *)&(args->second).ct;
    uVar6 = (args->second).ct.argb.pad;
    uVar4 = (args->second).field_0xe;
    uVar5 = (args->second).field_0xf;
    lVar9 = *(long *)(this + 0x10);
    QArrayDataPointer<std::pair<double,_QColor>_>::detachAndGrow
              ((QArrayDataPointer<std::pair<double,_QColor>_> *)this,(uint)(i == 0 && lVar9 != 0),1,
               (pair<double,_QColor> **)0x0,(QArrayDataPointer<std::pair<double,_QColor>_> *)0x0);
    lVar11 = *(long *)(this + 8);
    if (i != 0 || lVar9 == 0) {
      pdVar1 = (double *)(lVar11 + i * 0x18);
      memmove(pdVar1 + 3,(void *)(lVar11 + i * 0x18),(*(long *)(this + 0x10) - i) * 0x18);
      *pdVar1 = dVar2;
      *(Spec *)(pdVar1 + 1) = SVar7;
      *(undefined8 *)((long)pdVar1 + 0xc) = uVar3;
      *(ushort *)((long)pdVar1 + 0x14) = uVar6;
      *(undefined1 *)((long)pdVar1 + 0x16) = uVar4;
      *(undefined1 *)((long)pdVar1 + 0x17) = uVar5;
      goto LAB_0035a34d;
    }
    *(double *)(lVar11 + -0x18) = dVar2;
    *(Spec *)(lVar11 + -0x10) = SVar7;
    *(undefined8 *)(lVar11 + -0xc) = uVar3;
    *(ushort *)(lVar11 + -4) = uVar6;
    *(undefined1 *)(lVar11 + -2) = uVar4;
    *(undefined1 *)(lVar11 + -1) = uVar5;
  }
  else {
    if ((*(long *)(this + 0x10) == i) &&
       (lVar9 = *(long *)(this + 8),
       *(long *)(piVar8 + 2) - i !=
       ((long)(lVar9 - ((long)piVar8 + 0x1fU & 0xfffffffffffffff0)) >> 3) * -0x5555555555555555)) {
      *(undefined8 *)(lVar9 + 0x10 + i * 0x18) = *(undefined8 *)((long)&(args->second).ct + 4);
      dVar2 = *(double *)&args->second;
      pdVar1 = (double *)(lVar9 + i * 0x18);
      *pdVar1 = args->first;
      pdVar1[1] = dVar2;
      goto LAB_0035a34d;
    }
    if ((i != 0) ||
       (uVar10 = *(ulong *)(this + 8), ((long)piVar8 + 0x1fU & 0xfffffffffffffff0) == uVar10))
    goto LAB_0035a269;
    *(undefined8 *)(uVar10 - 8) = *(undefined8 *)((long)&(args->second).ct + 4);
    uVar3 = *(undefined8 *)&args->second;
    *(double *)(uVar10 - 0x18) = args->first;
    *(undefined8 *)(uVar10 - 0x10) = uVar3;
  }
  *(long *)(this + 8) = *(long *)(this + 8) + -0x18;
LAB_0035a34d:
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }